

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall
Memory::Recycler::VerifyPageHeapFillAfterAlloc
          (Recycler *this,char *memBlock,size_t size,ObjectInfoBits attributes)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  LargeHeapBlock *this_00;
  IdleDecommitPageAllocator *pIVar4;
  undefined8 *in_FS_OFFSET;
  
  if (memBlock == (char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1e54,"(memBlock != nullptr)","memBlock != nullptr");
    if (!bVar3) goto LAB_00291c64;
    *puVar1 = 0;
  }
  if (this->isPageHeapEnabled == true) {
    this_00 = (LargeHeapBlock *)FindHeapBlock(this,memBlock);
    if (this_00 == (LargeHeapBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1e58,"(heapBlock)","heapBlock");
      if (!bVar3) {
LAB_00291c64:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
    if ((((this_00->super_HeapBlock).heapBlockType == LargeBlockType) &&
        (this_00->pageHeapData != (PageHeapData *)0x0)) &&
       (this_00->pageHeapData->pageHeapMode != PageHeapModeOff)) {
      pIVar4 = HeapBlock::GetPageAllocator((HeapBlock *)this_00,this_00->heapInfo);
      if ((pIVar4->super_PageAllocator).disablePageReuse == false) {
        LargeHeapBlock::VerifyPageHeapPattern(this_00);
        return;
      }
    }
  }
  return;
}

Assistant:

void Recycler::VerifyPageHeapFillAfterAlloc(char* memBlock, size_t size, ObjectInfoBits attributes)
{
    Assert(memBlock != nullptr);
    if (IsPageHeapEnabled())
    {
        HeapBlock* heapBlock = this->FindHeapBlock(memBlock);
        Assert(heapBlock);
        if (heapBlock->IsLargeHeapBlock())
        {
            LargeHeapBlock* largeHeapBlock = (LargeHeapBlock*)heapBlock;
            if (largeHeapBlock->InPageHeapMode()
#ifdef RECYCLER_NO_PAGE_REUSE
                && !largeHeapBlock->GetPageAllocator(largeHeapBlock->heapInfo)->IsPageReuseDisabled()
#endif
                )
            {
                largeHeapBlock->VerifyPageHeapPattern();
            }
        }
    }
}